

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_in.c
# Opt level: O1

gdImagePtr gdImageCreateFromGifCtx(gdIOCtxPtr fd)

{
  bool bVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  gdImagePtr im;
  long lVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  uchar c;
  uchar buf [16];
  int ZeroDataBlock;
  uchar ColorMap [3] [256];
  uchar localColorMap [3] [256];
  char local_76a;
  byte local_769;
  ushort local_768;
  char cStack_766;
  undefined1 uStack_765;
  byte bStack_764;
  char cStack_763;
  ushort local_762;
  uint local_760;
  uint local_754;
  uint local_750;
  uint local_74c;
  uint local_748;
  uint local_744;
  uint local_740;
  int local_73c;
  uint local_738 [64];
  uchar local_638 [768];
  uchar local_338 [776];
  
  local_73c = 0;
  memset(local_638,0,0x300);
  memset(local_338,0,0x300);
  iVar4 = gdGetBuf(&local_768,6,fd);
  if ((((iVar4 == 6) && (cStack_766 == 'F' && local_768 == 0x4947)) &&
      ((cStack_763 == 'a' && CONCAT11(bStack_764,uStack_765) == 0x3738 ||
       (cStack_763 == 'a' && CONCAT11(bStack_764,uStack_765) == 0x3938)))) &&
     (iVar4 = gdGetBuf(&local_768,7,fd), iVar4 == 7)) {
    local_740 = (uint)local_768;
    local_744 = (uint)CONCAT11(uStack_765,cStack_766);
    uVar7 = (uint)bStack_764;
    if ((-1 < (char)bStack_764) ||
       (iVar4 = ReadColorMap(fd,2 << (bStack_764 & 7),(uchar (*) [256])local_638), iVar4 == 0)) {
      local_754 = 0xffffffff;
      im = (gdImagePtr)0x0;
      local_748 = uVar7;
      do {
        iVar8 = 1;
        iVar4 = gdGetBuf(&local_76a,1,fd);
        if (iVar4 == 1) {
          if (local_76a == ';') {
LAB_00115a39:
            iVar8 = 4;
          }
          else if (local_76a == ',') {
            iVar4 = gdGetBuf(&local_768,9,fd);
            if (iVar4 == 9) {
              bVar6 = (byte)local_760 & 7;
              iVar8 = 1;
              uVar2 = CONCAT11(cStack_763,bStack_764);
              if (((uint)local_768 + (uint)uVar2 <= local_740) &&
                 ((uint)CONCAT11(uStack_765,cStack_766) + (uint)local_762 <= local_744)) {
                local_769 = (byte)local_760;
                local_750 = (uint)local_762;
                local_74c = (uint)uVar2;
                im = gdImageCreate((uint)uVar2,(uint)local_762);
                if (im == (gdImagePtr)0x0) {
                  im = (gdImagePtr)0x0;
                }
                else {
                  uVar7 = local_760 >> 6 & 1;
                  im->interlace = uVar7;
                  if ((char)local_769 < '\0') {
                    iVar4 = ReadColorMap(fd,1 << bVar6 + 1,(uchar (*) [256])local_338);
                    if (iVar4 == 0) {
                      ReadImage(im,fd,local_74c,local_750,(uchar (*) [256])local_338,
                                local_760 >> 6 & 1,&local_73c);
                      goto LAB_00115a28;
                    }
                    gdImageDestroy(im);
                  }
                  else {
                    if ((char)local_748 < '\0') {
                      ReadImage(im,fd,local_74c,local_750,(uchar (*) [256])local_638,uVar7,
                                &local_73c);
LAB_00115a28:
                      if (local_754 != 0xffffffff) {
                        gdImageColorTransparent(im,local_754);
                      }
                      goto LAB_00115a39;
                    }
                    gdImageDestroy(im);
                  }
                }
              }
            }
          }
          else {
            if (local_76a == '!') {
              iVar8 = 1;
              iVar4 = gdGetBuf(&local_76a,1,fd);
              if (iVar4 != 1) goto LAB_00115a3f;
              if (local_76a == -7) {
                local_738[0] = 0;
                GetDataBlock(fd,(uchar *)local_738,&local_73c);
                uVar3 = local_738[0];
                uVar7 = local_738[0] >> 0x18;
                do {
                  iVar4 = GetDataBlock(fd,(uchar *)local_738,&local_73c);
                } while (0 < iVar4);
                if ((uVar3 & 1) != 0) {
                  local_754 = uVar7;
                }
              }
              else {
                do {
                  iVar4 = GetDataBlock(fd,(uchar *)local_738,&local_73c);
                } while (0 < iVar4);
              }
            }
            iVar8 = 3;
          }
        }
LAB_00115a3f:
      } while (iVar8 == 3);
      if ((iVar8 == 4) && (im != (gdImagePtr)0x0)) {
        lVar5 = (long)im->colorsTotal;
        if (0 < (long)im->colorsTotal) {
          do {
            if (im->open[lVar5 + -1] == 0) break;
            im->colorsTotal = im->colorsTotal + -1;
            bVar1 = 1 < lVar5;
            lVar5 = lVar5 + -1;
          } while (bVar1);
        }
        if (im->colorsTotal != 0) {
          return im;
        }
        gdImageDestroy(im);
      }
    }
  }
  return (gdImagePtr)0x0;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromGifCtx(gdIOCtxPtr fd)
{
	int BitPixel;
#if 0
	int ColorResolution;
	int Background;
	int AspectRatio;
#endif
	int Transparent = (-1);
	unsigned char buf[16];
	unsigned char c;
	unsigned char ColorMap[3][MAXCOLORMAPSIZE];
	unsigned char localColorMap[3][MAXCOLORMAPSIZE];
	int imw, imh, screen_width, screen_height;
	int useGlobalColormap;
	int bitPixel, i;
	/*1.4//int             imageCount = 0; */
	/* 2.0.28: threadsafe storage */
	int ZeroDataBlock = FALSE;
	int haveGlobalColormap;

	gdImagePtr im = 0;

	memset(ColorMap, 0, 3 * MAXCOLORMAPSIZE);
	memset(localColorMap, 0, 3 * MAXCOLORMAPSIZE);

	if(!ReadOK(fd, buf, 6)) {
		return 0;
	}

	if(strncmp((char *)buf, "GIF", 3) != 0) {
		return 0;
	}

	if(memcmp((char *)buf + 3, "87a", 3) == 0) {
		/* GIF87a */
	} else if(memcmp((char *)buf + 3, "89a", 3) == 0) {
		/* GIF89a */
	} else {
		return 0;
	}

	if(!ReadOK(fd, buf, 7)) {
		return 0;
	}

	BitPixel = 2 << (buf[4] & 0x07);
#if 0
	ColorResolution = (int) (((buf[4]&0x70)>>3)+1);
	Background = buf[5];
	AspectRatio = buf[6];
#endif
	screen_width = imw = LM_to_uint(buf[0], buf[1]);
	screen_height = imh = LM_to_uint(buf[2], buf[3]);

	haveGlobalColormap = BitSet(buf[4], LOCALCOLORMAP); /* Global Colormap */
	if(haveGlobalColormap) {
		if(ReadColorMap(fd, BitPixel, ColorMap)) {
			return 0;
		}
	}

	for (;;) {
		int top, left;
		int width, height;

		if(!ReadOK(fd, &c, 1)) {
			return 0;
		}

		if (c == ';') { /* GIF terminator */
			goto terminated;
		}

		if(c == '!') { /* Extension */
			if(!ReadOK(fd, &c, 1)) {
				return 0;
			}

			DoExtension(fd, c, &Transparent, &ZeroDataBlock);
			continue;
		}

		if(c != ',') { /* Not a valid start character */
			continue;
		}

		/*1.4//++imageCount; */

		if(!ReadOK(fd, buf, 9)) {
			return 0;
		}

		useGlobalColormap = !BitSet(buf[8], LOCALCOLORMAP);

		bitPixel = 1 << ((buf[8] & 0x07) + 1);
		left = LM_to_uint(buf[0], buf[1]);
		top = LM_to_uint(buf[2], buf[3]);
		width = LM_to_uint(buf[4], buf[5]);
		height = LM_to_uint(buf[6], buf[7]);

		if(((left + width) > screen_width) || ((top + height) > screen_height)) {
			if(VERBOSE) {
				printf("Frame is not confined to screen dimension.\n");
			}
			return 0;
		}

		if(!(im = gdImageCreate(width, height))) {
			return 0;
		}

		im->interlace = BitSet(buf[8], INTERLACE);
		if(!useGlobalColormap) {
			if(ReadColorMap(fd, bitPixel, localColorMap)) {
				gdImageDestroy(im);
				return 0;
			}

			ReadImage(im, fd, width, height, localColorMap, BitSet(buf[8], INTERLACE), &ZeroDataBlock);
		} else {
			if(!haveGlobalColormap) {
				gdImageDestroy(im);
				return 0;
			}

			ReadImage(im, fd, width, height, ColorMap, BitSet(buf[8], INTERLACE), &ZeroDataBlock);
		}

		if(Transparent != (-1)) {
			gdImageColorTransparent(im, Transparent);
		}

		goto terminated;
	}

terminated:
	/* Terminator before any image was declared! */
	if(!im) {
		return 0;
	}

	/* Check for open colors at the end, so
	 * we can reduce colorsTotal and ultimately
	 * BitsPerPixel */
	for(i = im->colorsTotal - 1; i >= 0; i--) {
		if(im->open[i]) {
			im->colorsTotal--;
		} else {
			break;
		}
	}

	if(!im->colorsTotal) {
		gdImageDestroy(im);
		return 0;
	}

	return im;
}